

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  bool bVar1;
  void *pvVar2;
  U32 UVar3;
  uint uVar4;
  ZSTD_ErrorCode ZVar5;
  void *pvVar6;
  size_t sVar7;
  size_t res;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t skippableSize;
  U32 magicNumber;
  int moreThan1Frame;
  void *dststart;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  
  bVar1 = false;
  dict_local = (void *)srcSize;
  srcSize_local = (size_t)src;
  src_local = (void *)dstCapacity;
  dstCapacity_local = (size_t)dst;
  dst_local = dctx;
  dststart = dict;
  if (ddict != (ZSTD_DDict *)0x0) {
    dststart = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  while( true ) {
    while( true ) {
      pvVar2 = dict_local;
      pvVar6 = (void *)ZSTD_startingInputLength(*(ZSTD_format_e *)((long)dst_local + 0x7590));
      if (pvVar2 < pvVar6) {
        if (dict_local == (void *)0x0) {
          dctx_local = (ZSTD_DCtx *)(dstCapacity_local - (long)dst);
        }
        else {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffb8;
        }
        return (size_t)dctx_local;
      }
      UVar3 = MEM_readLE32((void *)srcSize_local);
      if ((UVar3 & 0xfffffff0) != 0x184d2a50) break;
      sVar7 = readSkippableFrameSize((void *)srcSize_local,(size_t)dict_local);
      uVar4 = ERR_isError(sVar7);
      if (uVar4 != 0) {
        return sVar7;
      }
      srcSize_local = sVar7 + srcSize_local;
      dict_local = (void *)((long)dict_local - sVar7);
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar7 = ZSTD_decompressBegin_usingDict((ZSTD_DCtx *)dst_local,dststart,dictSize);
      uVar4 = ERR_isError(sVar7);
    }
    else {
      sVar7 = ZSTD_decompressBegin_usingDDict((ZSTD_DCtx *)dst_local,ddict);
      uVar4 = ERR_isError(sVar7);
    }
    if (uVar4 != 0) break;
    ZSTD_checkContinuity((ZSTD_DCtx *)dst_local,(void *)dstCapacity_local,(size_t)src_local);
    sVar7 = ZSTD_decompressFrame
                      ((ZSTD_DCtx *)dst_local,(void *)dstCapacity_local,(size_t)src_local,
                       (void **)&srcSize_local,(size_t *)&dict_local);
    ZVar5 = ZSTD_getErrorCode(sVar7);
    if ((ZVar5 == ZSTD_error_prefix_unknown) && (bVar1)) {
      return 0xffffffffffffffb8;
    }
    uVar4 = ERR_isError(sVar7);
    if (uVar4 != 0) {
      return sVar7;
    }
    if (sVar7 != 0) {
      dstCapacity_local = sVar7 + dstCapacity_local;
    }
    src_local = (void *)((long)src_local - sVar7);
    bVar1 = true;
  }
  return sVar7;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "readSkippableFrameSize failed");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}